

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# discrete_dist.hpp
# Opt level: O0

basic_istream<char,_std::char_traits<char>_> *
trng::operator>>(basic_istream<char,_std::char_traits<char>_> *in,param_type *P)

{
  undefined1 uVar1;
  fmtflags __fmtfl;
  _Ios_Fmtflags _Var2;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> last;
  param_type *this;
  istream *in_RDI;
  size_type i;
  fmtflags flags;
  vector<double,_std::allocator<double>_> P_new;
  size_type n;
  double p;
  param_type *in_stack_fffffffffffffef8;
  param_type *in_stack_ffffffffffffff00;
  value_type_conflict6 *in_stack_ffffffffffffff08;
  undefined7 in_stack_ffffffffffffff10;
  undefined1 in_stack_ffffffffffffff17;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> first;
  ulong local_58;
  ulong local_20;
  double local_18 [2];
  istream *local_8;
  
  local_8 = in_RDI;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x395be4);
  __fmtfl = Catch::clara::std::ios_base::flags
                      ((ios_base *)(local_8 + *(long *)((long)*(double *)local_8 + -0x18)));
  last._M_current = (double *)(local_8 + *(long *)((long)*(double *)local_8 + -0x18));
  _Var2 = Catch::clara::std::operator|(_S_dec,_S_fixed);
  _Var2 = Catch::clara::std::operator|(_Var2,_S_left);
  Catch::clara::std::ios_base::flags((ios_base *)last._M_current,_Var2);
  first._M_current = (double *)local_8;
  utility::delim('\0');
  this = (param_type *)
         utility::operator>>((basic_istream<char,_std::char_traits<char>_> *)
                             in_stack_ffffffffffffff00,(delim_c *)in_stack_fffffffffffffef8);
  std::istream::operator>>((istream *)this,&local_20);
  utility::delim('\0');
  utility::operator>>((basic_istream<char,_std::char_traits<char>_> *)in_stack_ffffffffffffff00,
                      (delim_c *)in_stack_fffffffffffffef8);
  for (local_58 = 0; local_58 < local_20; local_58 = local_58 + 1) {
    std::istream::operator>>(local_8,local_18);
    if (local_58 + 1 < local_20) {
      utility::delim('\0');
      utility::operator>>((basic_istream<char,_std::char_traits<char>_> *)in_stack_ffffffffffffff00,
                          (delim_c *)in_stack_fffffffffffffef8);
    }
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)
               CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10),
               in_stack_ffffffffffffff08);
  }
  utility::delim('\0');
  utility::operator>>((basic_istream<char,_std::char_traits<char>_> *)in_stack_ffffffffffffff00,
                      (delim_c *)in_stack_fffffffffffffef8);
  uVar1 = std::ios::operator_cast_to_bool((ios *)(local_8 + *(long *)(*(long *)local_8 + -0x18)));
  if ((bool)uVar1) {
    std::vector<double,_std::allocator<double>_>::begin(&in_stack_fffffffffffffef8->P_);
    std::vector<double,_std::allocator<double>_>::end(&in_stack_fffffffffffffef8->P_);
    discrete_dist::param_type::
    param_type<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
              (this,first,last);
    discrete_dist::param_type::operator=(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    discrete_dist::param_type::~param_type((param_type *)0x395e69);
  }
  Catch::clara::std::ios_base::flags
            ((ios_base *)(local_8 + *(long *)(*(long *)local_8 + -0x18)),__fmtfl);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)CONCAT17(uVar1,in_stack_ffffffffffffff10));
  return (basic_istream<char,_std::char_traits<char>_> *)local_8;
}

Assistant:

std::basic_istream<char_t, traits_t> &operator>>(std::basic_istream<char_t, traits_t> &in,
                                                   discrete_dist::param_type &P) {
    double p;
    std::vector<double>::size_type n;
    std::vector<double> P_new;
    std::ios_base::fmtflags flags(in.flags());
    in.flags(std::ios_base::dec | std::ios_base::fixed | std::ios_base::left);
    in >> utility::delim('(') >> n >> utility::delim(' ');
    for (std::vector<double>::size_type i{0}; i < n; ++i) {
      in >> p;
      if (i + 1 < n)
        in >> utility::delim(' ');
      P_new.push_back(p);
    }
    in >> utility::delim(')');
    if (in)
      P = discrete_dist::param_type(P_new.begin(), P_new.end());
    in.flags(flags);
    return in;
  }